

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void dwt_encode_1_real(int *a,int dn,int sn,int cas)

{
  int iVar1;
  int in_ECX;
  int iVar2;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int i;
  int local_b8;
  int local_b4;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_20;
  int local_1c;
  int local_18;
  
  if (in_ECX == 0) {
    if ((0 < in_ESI) || (1 < in_EDX)) {
      for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
        if (local_18 < 0) {
          local_1c = *in_RDI;
        }
        else {
          if (local_18 < in_EDX) {
            local_20 = in_RDI[local_18 << 1];
          }
          else {
            local_20 = in_RDI[(in_EDX + -1) * 2];
          }
          local_1c = local_20;
        }
        if (local_18 + 1 < 0) {
          local_28 = *in_RDI;
        }
        else {
          if (local_18 + 1 < in_EDX) {
            local_2c = in_RDI[(local_18 + 1) * 2];
          }
          else {
            local_2c = in_RDI[(in_EDX + -1) * 2];
          }
          local_28 = local_2c;
        }
        iVar1 = fix_mul(local_1c + local_28,0x32c1);
        iVar2 = local_18 * 2 + 1;
        in_RDI[iVar2] = in_RDI[iVar2] - iVar1;
      }
      for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
        if (local_18 + -1 < 0) {
          local_30 = in_RDI[1];
        }
        else {
          if (local_18 + -1 < in_ESI) {
            local_34 = in_RDI[(local_18 + -1) * 2 + 1];
          }
          else {
            local_34 = in_RDI[(in_ESI + -1) * 2 + 1];
          }
          local_30 = local_34;
        }
        if (local_18 < 0) {
          local_3c = in_RDI[1];
        }
        else {
          if (local_18 < in_ESI) {
            local_40 = in_RDI[local_18 * 2 + 1];
          }
          else {
            local_40 = in_RDI[(in_ESI + -1) * 2 + 1];
          }
          local_3c = local_40;
        }
        iVar1 = fix_mul(local_30 + local_3c,0x1b2);
        in_RDI[local_18 << 1] = in_RDI[local_18 << 1] - iVar1;
      }
      for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
        if (local_18 < 0) {
          local_44 = *in_RDI;
        }
        else {
          if (local_18 < in_EDX) {
            local_48 = in_RDI[local_18 << 1];
          }
          else {
            local_48 = in_RDI[(in_EDX + -1) * 2];
          }
          local_44 = local_48;
        }
        if (local_18 + 1 < 0) {
          local_50 = *in_RDI;
        }
        else {
          if (local_18 + 1 < in_EDX) {
            local_54 = in_RDI[(local_18 + 1) * 2];
          }
          else {
            local_54 = in_RDI[(in_EDX + -1) * 2];
          }
          local_50 = local_54;
        }
        iVar1 = fix_mul(local_44 + local_50,0x1c41);
        iVar2 = local_18 * 2 + 1;
        in_RDI[iVar2] = iVar1 + in_RDI[iVar2];
      }
      for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
        if (local_18 + -1 < 0) {
          local_58 = in_RDI[1];
        }
        else {
          if (local_18 + -1 < in_ESI) {
            local_5c = in_RDI[(local_18 + -1) * 2 + 1];
          }
          else {
            local_5c = in_RDI[(in_ESI + -1) * 2 + 1];
          }
          local_58 = local_5c;
        }
        if (local_18 < 0) {
          local_64 = in_RDI[1];
        }
        else {
          if (local_18 < in_ESI) {
            local_68 = in_RDI[local_18 * 2 + 1];
          }
          else {
            local_68 = in_RDI[(in_ESI + -1) * 2 + 1];
          }
          local_64 = local_68;
        }
        iVar1 = fix_mul(local_58 + local_64,0xe31);
        in_RDI[local_18 << 1] = iVar1 + in_RDI[local_18 << 1];
      }
      for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
        iVar1 = fix_mul(in_RDI[local_18 * 2 + 1],0x13ae);
        in_RDI[local_18 * 2 + 1] = iVar1;
      }
      for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
        iVar1 = fix_mul(in_RDI[local_18 << 1],0x1a03);
        in_RDI[local_18 << 1] = iVar1;
      }
    }
  }
  else if ((0 < in_EDX) || (1 < in_ESI)) {
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      if (local_18 < 0) {
        local_6c = in_RDI[1];
      }
      else {
        if (local_18 < in_EDX) {
          local_70 = in_RDI[local_18 * 2 + 1];
        }
        else {
          local_70 = in_RDI[(in_EDX + -1) * 2 + 1];
        }
        local_6c = local_70;
      }
      if (local_18 + -1 < 0) {
        local_78 = in_RDI[1];
      }
      else {
        if (local_18 + -1 < in_EDX) {
          local_7c = in_RDI[(local_18 + -1) * 2 + 1];
        }
        else {
          local_7c = in_RDI[(in_EDX + -1) * 2 + 1];
        }
        local_78 = local_7c;
      }
      iVar1 = fix_mul(local_6c + local_78,0x32c1);
      in_RDI[local_18 << 1] = in_RDI[local_18 << 1] - iVar1;
    }
    for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
      if (local_18 < 0) {
        local_80 = *in_RDI;
      }
      else {
        if (local_18 < in_ESI) {
          local_84 = in_RDI[local_18 << 1];
        }
        else {
          local_84 = in_RDI[(in_ESI + -1) * 2];
        }
        local_80 = local_84;
      }
      if (local_18 + 1 < 0) {
        local_8c = *in_RDI;
      }
      else {
        if (local_18 + 1 < in_ESI) {
          local_90 = in_RDI[(local_18 + 1) * 2];
        }
        else {
          local_90 = in_RDI[(in_ESI + -1) * 2];
        }
        local_8c = local_90;
      }
      iVar1 = fix_mul(local_80 + local_8c,0x1b2);
      iVar2 = local_18 * 2 + 1;
      in_RDI[iVar2] = in_RDI[iVar2] - iVar1;
    }
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      if (local_18 < 0) {
        local_94 = in_RDI[1];
      }
      else {
        if (local_18 < in_EDX) {
          local_98 = in_RDI[local_18 * 2 + 1];
        }
        else {
          local_98 = in_RDI[(in_EDX + -1) * 2 + 1];
        }
        local_94 = local_98;
      }
      if (local_18 + -1 < 0) {
        local_a0 = in_RDI[1];
      }
      else {
        if (local_18 + -1 < in_EDX) {
          local_a4 = in_RDI[(local_18 + -1) * 2 + 1];
        }
        else {
          local_a4 = in_RDI[(in_EDX + -1) * 2 + 1];
        }
        local_a0 = local_a4;
      }
      iVar1 = fix_mul(local_94 + local_a0,0x1c41);
      in_RDI[local_18 << 1] = iVar1 + in_RDI[local_18 << 1];
    }
    for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
      if (local_18 < 0) {
        local_a8 = *in_RDI;
      }
      else {
        if (local_18 < in_ESI) {
          local_ac = in_RDI[local_18 << 1];
        }
        else {
          local_ac = in_RDI[(in_ESI + -1) * 2];
        }
        local_a8 = local_ac;
      }
      if (local_18 + 1 < 0) {
        local_b4 = *in_RDI;
      }
      else {
        if (local_18 + 1 < in_ESI) {
          local_b8 = in_RDI[(local_18 + 1) * 2];
        }
        else {
          local_b8 = in_RDI[(in_ESI + -1) * 2];
        }
        local_b4 = local_b8;
      }
      iVar1 = fix_mul(local_a8 + local_b4,0xe31);
      iVar2 = local_18 * 2 + 1;
      in_RDI[iVar2] = iVar1 + in_RDI[iVar2];
    }
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      iVar1 = fix_mul(in_RDI[local_18 << 1],0x13ae);
      in_RDI[local_18 << 1] = iVar1;
    }
    for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
      iVar1 = fix_mul(in_RDI[local_18 * 2 + 1],0x1a03);
      in_RDI[local_18 * 2 + 1] = iVar1;
    }
  }
  return;
}

Assistant:

static void dwt_encode_1_real(int *a, int dn, int sn, int cas) {
	int i;
	if (!cas) {
		if ((dn > 0) || (sn > 1)) {	/* NEW :  CASE ONE ELEMENT */
			for (i = 0; i < dn; i++)
				D(i) -= fix_mul(S_(i) + S_(i + 1), 12993);
			for (i = 0; i < sn; i++)
				S(i) -= fix_mul(D_(i - 1) + D_(i), 434);
			for (i = 0; i < dn; i++)
				D(i) += fix_mul(S_(i) + S_(i + 1), 7233);
			for (i = 0; i < sn; i++)
				S(i) += fix_mul(D_(i - 1) + D_(i), 3633);
			for (i = 0; i < dn; i++)
				D(i) = fix_mul(D(i), 5038);	/*5038 */
			for (i = 0; i < sn; i++)
				S(i) = fix_mul(S(i), 6659);	/*6660 */
		}
	} else {
		if ((sn > 0) || (dn > 1)) {	/* NEW :  CASE ONE ELEMENT */
			for (i = 0; i < dn; i++)
				S(i) -= fix_mul(DD_(i) + DD_(i - 1), 12993);
			for (i = 0; i < sn; i++)
				D(i) -= fix_mul(SS_(i) + SS_(i + 1), 434);
			for (i = 0; i < dn; i++)
				S(i) += fix_mul(DD_(i) + DD_(i - 1), 7233);
			for (i = 0; i < sn; i++)
				D(i) += fix_mul(SS_(i) + SS_(i + 1), 3633);
			for (i = 0; i < dn; i++)
				S(i) = fix_mul(S(i), 5038);	/*5038 */
			for (i = 0; i < sn; i++)
				D(i) = fix_mul(D(i), 6659);	/*6660 */
		}
	}
}